

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest_TestExternalResizeWorksUsePSNR_Test::TestBody
          (ResizeRealtimeTest_TestExternalResizeWorksUsePSNR_Test *this)

{
  bool bVar1;
  ResizeRealtimeTest *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  uint expected_h;
  uint expected_w;
  uint frame;
  FrameInfo *info;
  iterator __end2;
  iterator __begin2;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *__range2;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int i;
  ResizingVideoSource video;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *in_stack_fffffffffffffe28;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  ResizingVideoSource *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int line;
  Message *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe58;
  Type type;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe60;
  Message *in_stack_fffffffffffffea8;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertionResult local_140 [2];
  AssertionResult local_120 [2];
  AssertionResult local_100;
  undefined1 local_ec [8];
  uint local_e4;
  reference local_e0;
  FrameInfo *local_d8;
  __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
  local_d0;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *local_c8;
  uint local_ac;
  size_type local_a8;
  AssertionResult local_a0 [2];
  uint local_7c;
  HasNewFatalFailureHelper local_78;
  int local_4c;
  DummyVideoSource local_48;
  byte local_18;
  
  ResizingVideoSource::ResizingVideoSource
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  local_48._44_4_ = 1;
  in_RDI->change_bitrate_ = false;
  in_RDI->set_scale_mode_ = false;
  in_RDI->set_scale_mode2_ = false;
  in_RDI->set_scale_mode3_ = false;
  in_RDI->mismatch_psnr_ = 0.0;
  in_RDI->mismatch_nframes_ = 0;
  (in_RDI->super_EncoderTest).init_flags_ = 0x10000;
  (in_RDI->super_EncoderTest).cfg_.rc_dropframe_thresh = 0x1e;
  ResizeRealtimeTest::DefaultConfig(in_RDI);
  local_4c = 0;
  do {
    if (1 < local_4c) {
      local_7c = 0;
LAB_008e1abf:
      ResizingVideoSource::~ResizingVideoSource((ResizingVideoSource *)0x8e1acc);
      return;
    }
    local_18 = local_4c != 0;
    bVar1 = testing::internal::AlwaysTrue();
    type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if (!bVar1) {
LAB_008e12f2:
      line = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe60,type,(char *)in_stack_fffffffffffffe50,
                 line,(char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0x8e1359);
      local_7c = 1;
      goto LAB_008e1abf;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe60)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,&local_48);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_78);
    if (bVar1) {
      local_7c = 5;
    }
    else {
      local_7c = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (in_stack_fffffffffffffe30);
    type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if (local_7c != 0) {
      if (local_7c == 5) goto LAB_008e12f2;
      goto LAB_008e1abf;
    }
    local_a8 = std::
               vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ::size(&in_RDI->frame_info_list_);
    local_ac = libaom_test::DummyVideoSource::limit(&local_48);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (uint *)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      testing::AssertionResult::failure_message((AssertionResult *)0x8e1440);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe60,
                 (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),(char *)in_stack_fffffffffffffe50,
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0x8e149d);
    }
    local_7c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e1524);
    if (local_7c != 0) goto LAB_008e1abf;
    local_c8 = &in_RDI->frame_info_list_;
    local_d0._M_current =
         (FrameInfo *)
         std::
         vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
         ::begin(in_stack_fffffffffffffe28);
    local_d8 = (FrameInfo *)
               std::
               vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ::end(in_stack_fffffffffffffe28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                               *)in_stack_fffffffffffffe30,
                              (__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                               *)in_stack_fffffffffffffe28), bVar1) {
      local_e0 = __gnu_cxx::
                 __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                 ::operator*(&local_d0);
      local_e4 = (uint)local_e0->pts;
      in_stack_fffffffffffffe30 = (HasNewFatalFailureHelper *)local_ec;
      in_stack_fffffffffffffe28 =
           (vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
            *)(local_ec + 4);
      ScaleForFrameNumber(local_e4,0x140,0xf0,local_48._44_4_,(bool)(local_18 & 1),false,
                          (uint *)in_stack_fffffffffffffe28,(uint *)in_stack_fffffffffffffe30);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                 (uint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (uint *)in_stack_fffffffffffffe30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffe30,(char (*) [7])in_stack_fffffffffffffe28);
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffe30,(uint *)in_stack_fffffffffffffe28);
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffe30,(char (*) [22])in_stack_fffffffffffffe28);
        testing::AssertionResult::failure_message((AssertionResult *)0x8e16c2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe60,
                   (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x8e171c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e178a);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                 (uint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (uint *)in_stack_fffffffffffffe30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe60 =
             (HasNewFatalFailureHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,(char (*) [7])in_stack_fffffffffffffe28
                       );
        in_stack_fffffffffffffe58 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,(uint *)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe50 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe30,
                        (char (*) [23])in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe48 =
             testing::AssertionResult::failure_message((AssertionResult *)0x8e184d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe60,
                   (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x8e18a7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e1915);
      ResizeRealtimeTest::GetMismatchFrames(in_RDI);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                 (uint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (uint *)in_stack_fffffffffffffe30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe40 =
             (ResizingVideoSource *)
             testing::AssertionResult::failure_message((AssertionResult *)0x8e19a4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe60,
                   (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x8e1a01);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e1a6c);
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
      ::operator++(&local_d0);
    }
    std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
    ::clear((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
             *)0x8e1a9e);
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

TEST_P(ResizeRealtimeTest, TestExternalResizeWorksUsePSNR) {
  ResizingVideoSource video(kInitialWidth, kInitialHeight);
  video.flag_codec_ = 1;
  change_bitrate_ = false;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  init_flags_ = AOM_CODEC_USE_PSNR;
  cfg_.rc_dropframe_thresh = 30;
  DefaultConfig();
  // Test external resizing with start resolution equal to
  // 1. kInitialWidth and kInitialHeight
  // 2. down-scaled kInitialWidth and kInitialHeight
  for (int i = 0; i < 2; i++) {
    video.change_start_resln_ = static_cast<bool>(i);

    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
#if CONFIG_AV1_DECODER
    // Check we decoded the same number of frames as we attempted to encode
    ASSERT_EQ(frame_info_list_.size(), video.limit());
    for (const auto &info : frame_info_list_) {
      const unsigned int frame = static_cast<unsigned>(info.pts);
      unsigned int expected_w;
      unsigned int expected_h;
      ScaleForFrameNumber(frame, kInitialWidth, kInitialHeight,
                          video.flag_codec_, video.change_start_resln_, false,
                          &expected_w, &expected_h);
      EXPECT_EQ(expected_w, info.w)
          << "Frame " << frame << " had unexpected width";
      EXPECT_EQ(expected_h, info.h)
          << "Frame " << frame << " had unexpected height";
      EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
    }
#else
    printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
    frame_info_list_.clear();
  }
}